

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O3

void __thiscall OpenMD::shapedLattice::findSites(shapedLattice *this)

{
  uint uVar1;
  pointer pVVar2;
  bool bVar3;
  int nx;
  int ny;
  int iVar4;
  int iVar5;
  uint nz;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> pointsOrt;
  Vector3d myOrt;
  Vector3d myPoint;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_d8;
  ulong local_b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_b0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_a8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_a0;
  Vector3<double> local_88;
  Vector3<double> local_68;
  Vector3<double> local_48;
  
  pVVar2 = (this->sites_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->sites_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar2 = (this->orientations_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->orientations_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar2) {
    (this->orientations_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (&local_a0,&this->simpleLattice_->cellSitesOrt);
  iVar5 = this->endNx_;
  if (this->beginNx_ <= iVar5) {
    local_a8 = &this->sites_;
    local_b0 = &this->orientations_;
    uVar1 = this->simpleLattice_->nCellSites;
    iVar4 = this->endNy_;
    nx = this->beginNx_;
    do {
      if (this->beginNy_ <= iVar4) {
        iVar5 = this->endNz_;
        ny = this->beginNy_;
        do {
          nz = this->beginNz_;
          if ((int)nz <= iVar5) {
            do {
              Lattice::getLatticePointsPos(this->simpleLattice_,&local_d8,nx,ny,nz);
              local_b8 = (ulong)nz;
              if (0 < (int)uVar1) {
                lVar7 = 0;
                uVar8 = 0;
                do {
                  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
                  local_48.super_Vector<double,_3U>.data_[1] = 0.0;
                  local_48.super_Vector<double,_3U>.data_[2] = 0.0;
                  if (&local_48 !=
                      local_d8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar8) {
                    lVar6 = 0;
                    do {
                      local_48.super_Vector<double,_3U>.data_[lVar6] =
                           *(double *)
                            ((long)((local_d8.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_Vector<double,_3U>).data_ + lVar6 * 8 + lVar7);
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                  }
                  iVar5 = (*this->_vptr_shapedLattice[2])(this,&local_48);
                  if ((char)iVar5 != '\0') {
                    local_68.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_68.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_68.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (&local_68 !=
                        local_d8.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar8) {
                      lVar6 = 0;
                      do {
                        local_68.super_Vector<double,_3U>.data_[lVar6] =
                             *(double *)
                              ((long)((local_d8.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_Vector<double,_3U>).data_ + lVar6 * 8 + lVar7);
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 3);
                    }
                    local_88.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_88.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_88.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (&local_88 !=
                        local_a0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar8) {
                      lVar6 = 0;
                      do {
                        local_88.super_Vector<double,_3U>.data_[lVar6] =
                             *(double *)
                              ((long)((local_a0.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_Vector<double,_3U>).data_ + lVar6 * 8 + lVar7);
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 3);
                    }
                    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ::push_back(local_a8,&local_68);
                    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ::push_back(local_b0,&local_88);
                  }
                  uVar8 = uVar8 + 1;
                  lVar7 = lVar7 + 0x18;
                } while (uVar8 != uVar1);
              }
              nz = (int)local_b8 + 1;
              iVar5 = this->endNz_;
            } while ((int)local_b8 < iVar5);
            iVar4 = this->endNy_;
          }
          bVar3 = ny < iVar4;
          ny = ny + 1;
        } while (bVar3);
        iVar5 = this->endNx_;
      }
      bVar3 = nx < iVar5;
      nx = nx + 1;
    } while (bVar3);
  }
  this->sitesComputed_ = true;
  if (local_a0.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void shapedLattice::findSites() {
    sites_.clear();
    orientations_.clear();

    std::vector<Vector3d> latticePos;
    std::vector<Vector3d> pointsOrt = simpleLattice_->getLatticePointsOrt();
    int numMolPerCell               = simpleLattice_->getNumSitesPerCell();

    for (int i = beginNx_; i <= endNx_; i++) {
      for (int j = beginNy_; j <= endNy_; j++) {
        for (int k = beginNz_; k <= endNz_; k++) {
          // get the position of the cell sites
          simpleLattice_->getLatticePointsPos(latticePos, i, j, k);
          for (int l = 0; l < numMolPerCell; l++) {
            if (isInterior(latticePos[l])) {
              Vector3d myPoint = latticePos[l];
              Vector3d myOrt   = pointsOrt[l];
              sites_.push_back(myPoint);
              orientations_.push_back(myOrt);
            }
          }
        }
      }
    }
    sitesComputed_ = true;
  }